

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O1

IterateResult __thiscall
glcts::TessellationShaderTessellationInputPatchDiscard::iterate
          (TessellationShaderTessellationInputPatchDiscard *this)

{
  ostringstream *this_00;
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  void *__s;
  TestError *this_01;
  NotSupportedError *this_02;
  long lVar6;
  void *pvVar7;
  size_t __n;
  int iVar8;
  pointer p_Var9;
  void *pvVar10;
  long lVar11;
  bool bVar12;
  string primitive_mode_string;
  string local_1d0;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  long lVar5;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"Tessellation shader functionality not supported, skipping","");
    tcu::NotSupportedError::NotSupportedError(this_02,(string *)local_1b0);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  initTest(this);
  (**(code **)(lVar5 + 0x5e0))(0x8c89);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glEnable(GL_RASTERIZER_DISCARD) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x26e);
  (**(code **)(lVar5 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glPatchParameteriEXT() failed for GL_PATCH_VERTICES_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x272);
  p_Var9 = (this->m_runs).
           super__Vector_base<glcts::TessellationShaderTessellationInputPatchDiscard::_run,_std::allocator<glcts::TessellationShaderTessellationInputPatchDiscard::_run>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (p_Var9 != (this->m_runs).
                super__Vector_base<glcts::TessellationShaderTessellationInputPatchDiscard::_run,_std::allocator<glcts::TessellationShaderTessellationInputPatchDiscard::_run>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      __n = 0x48;
      if (p_Var9->primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS) {
        __n = 0x90;
      }
      if (p_Var9->primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_FIRST) {
        __n = 0x30;
      }
      (**(code **)(lVar5 + 0x150))(0x8c8e,__n,0,0x88e4);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glBufferData() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x28f);
      (**(code **)(lVar5 + 0x1680))(p_Var9->po_id);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glUseProgram() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x293);
      GVar4 = TessellationShaderUtils::getTFModeForPrimitiveMode(p_Var9->primitive_mode,false);
      (**(code **)(lVar5 + 0x30))(GVar4);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glBeginTransformFeedback() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x29a);
      (**(code **)(lVar5 + 0x538))((this->super_TestCaseBase).m_glExtTokens.PATCHES,0,4);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glDrawArrays() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x29d);
      (**(code **)(lVar5 + 0x638))();
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glEndTransformFeedback() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x2a0);
      __s = (void *)(**(code **)(lVar5 + 0xd00))(0x8c8e,0,__n,3);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glMapBufferRange() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x2a6);
      iVar2 = (uint)(p_Var9->primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS) * 3 + 3;
      if (p_Var9->primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_FIRST) {
        iVar2 = 2;
      }
      lVar6 = 0;
      pvVar7 = __s;
      do {
        iVar1 = (&DAT_01bab894)[lVar6];
        iVar8 = 0;
        pvVar10 = pvVar7;
        do {
          pvVar7 = (void *)((long)pvVar10 + 0xc);
          lVar11 = 0;
          do {
            if (*(int *)((long)pvVar10 + lVar11 * 4) != iVar1) {
              TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
                        (&local_1d0,(TessellationShaderUtils *)(ulong)p_Var9->primitive_mode,
                         (_tessellation_primitive_mode)pvVar7);
              local_1b0._0_8_ =
                   ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              this_00 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(this_00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,"For primitive mode: ",0x14);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00," invalid gl_PrimitiveID of value ",0x21);
              std::ostream::operator<<(this_00,*(int *)((long)pvVar10 + lVar11 * 4));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00," was found instead of expected ",0x1f);
              std::ostream::operator<<(this_00,iVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," at index:",10)
              ;
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(this_00);
              std::ios_base::~ios_base(local_138);
              this_01 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_01,"Discard mechanism failed",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                         ,0x2d5);
              __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
            lVar11 = lVar11 + 1;
          } while ((int)lVar11 != 3);
          iVar8 = iVar8 + 1;
          pvVar10 = pvVar7;
        } while (iVar8 != iVar2);
        bVar12 = lVar6 == 0;
        lVar6 = lVar6 + 1;
      } while (bVar12);
      memset(__s,0,__n);
      (**(code **)(lVar5 + 0x1670))(0x8c8e);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glUnmapBuffer() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x2e2);
      p_Var9 = p_Var9 + 1;
    } while (p_Var9 != (this->m_runs).
                       super__Vector_base<glcts::TessellationShaderTessellationInputPatchDiscard::_run,_std::allocator<glcts::TessellationShaderTessellationInputPatchDiscard::_run>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderTessellationInputPatchDiscard::iterate(void)
{
	/* Do not execute if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize ES test objects */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initTest();

	/* We don't need rasterization for this test */
	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) failed.");

	/* Configure amount of vertices per input patch */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() failed for GL_PATCH_VERTICES_EXT pname");

	/* Iterate through all tests configured */
	for (_runs_const_iterator run_iterator = m_runs.begin(); run_iterator != m_runs.end(); run_iterator++)
	{
		const _run& run = *run_iterator;

		/* Set up XFB target BO storage size. Each input patch will generate:
		 *
		 * a) 1 ivec2 and 1 int IF it is an odd patch;
		 * b) 0 bytes otherwise.
		 *
		 * This gives us a total of 2 * (sizeof(int)*2 + sizeof(int)) = 24 bytes per result coordinate,
		 * assuming it does not get discarded along the way.
		 *
		 * Amount of vertices that TE processes is mode-dependent. Note that for 'quads' we use 6 instead
		 * of 4 because the geometry will be broken down to triangles (1 quad = 2 triangles = 6 vertices)
		 * later in the pipeline.
		 */
		const unsigned int n_total_primitives = 4;
		const unsigned int n_vertices_per_patch =
			((run.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES) ?
				 2 :
				 (run.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS) ? 6 : 3);
		const unsigned int n_bytes_per_result_vertex = sizeof(int) + 2 * sizeof(int);
		const unsigned int n_bytes_needed = (n_total_primitives / 2) * n_vertices_per_patch * n_bytes_per_result_vertex;

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, n_bytes_needed, NULL, /* data */
					  GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed");

		/* Activate the program object */
		gl.useProgram(run.po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed");

		/* Draw the test geometry. */
		glw::GLenum tf_mode =
			TessellationShaderUtils::getTFModeForPrimitiveMode(run.primitive_mode, false); /* is_point_mode_enabled */

		gl.beginTransformFeedback(tf_mode);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() failed.");

		gl.drawArrays(m_glExtTokens.PATCHES, 0 /* first */, 1 /* vertices per patch */ * n_total_primitives);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed");

		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() failed");

		/* Map the BO with result data into user space */
		int* result_data = (int*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
												   n_bytes_needed, GL_MAP_READ_BIT | GL_MAP_WRITE_BIT);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed");

		/* Verification is based on the following reasoning:
		 *
		 * a) Both TC and TE stages should operate on the same primitive IDs (no re-ordering
		 *    of the IDs is allowed)
		 * b) Under test-specific configuration, tessellator will output 2 line segments (4 coordinates).
		 *    Two first two coordinates will be generated during tessellation of the second primitive,
		 *    and the other two coordinates will be generated during tessellation of the fourth primitive
		 *    (out of all four primitives that will enter the pipeline).
		 * c) In case of quads, 6 first coordinates will be generated during tessellation of the second primitive,
		 *    and the other six will be generated during tessellation of the fourth primitive.
		 * d) Finally, tessellator will output 2 triangles (6 coordinates). The first three coordinates will
		 *    be generated during tessellation of the second primitive, and the other two for the fourth
		 *    primitive.
		 * */
		const int expected_primitive_ids[] = {
			1, /* second primitive */
			3  /* fourth primitive */
		};
		const unsigned int n_expected_primitive_ids =
			sizeof(expected_primitive_ids) / sizeof(expected_primitive_ids[0]);
		const unsigned int n_expected_repetitions =
			(run.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES) ?
				2 :
				(run.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS) ? 6 : 3;
		const int* traveller_ptr = result_data;

		for (unsigned int n_primitive_id = 0; n_primitive_id < n_expected_primitive_ids; ++n_primitive_id)
		{
			int expected_primitive_id = expected_primitive_ids[n_primitive_id];

			for (unsigned int n_repetition = 0; n_repetition < n_expected_repetitions; ++n_repetition)
			{
				for (unsigned int n_integer = 0; n_integer < 3 /* ivec2 + int */; ++n_integer)
				{
					if (*traveller_ptr != expected_primitive_id)
					{
						std::string primitive_mode_string =
							TessellationShaderUtils::getESTokenForPrimitiveMode(run.primitive_mode);

						m_testCtx.getLog() << tcu::TestLog::Message << "For primitive mode: " << primitive_mode_string
										   << " invalid gl_PrimitiveID of value " << *traveller_ptr
										   << " was found instead of expected " << expected_primitive_id
										   << " at index:" << n_primitive_id * 3 /* ivec2 + int */ + n_integer
										   << tcu::TestLog::EndMessage;

						TCU_FAIL("Discard mechanism failed");
					}

					traveller_ptr++;
				} /* for (all captured integers) */
			}	 /* for (all repetitions) */
		}		  /* for (all non-discarded primitive ids) */

		/* Clear the buffer storage space before we unmap it */
		memset(result_data, 0, n_bytes_needed);

		/* Unmap the BO */
		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed");
	}

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}